

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

Status google::protobuf::json_internal::anon_unknown_5::
       ParseMap<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto3Type> field,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  int *piVar1;
  ulong uVar2;
  uint8_t *puVar3;
  undefined8 entry;
  _Alloc_hider _Var4;
  bool bVar5;
  char cVar6;
  int iVar7;
  Msg *in_RCX;
  Status *_status;
  char *in_R8;
  string_view literal;
  string_view url;
  string_view literal_00;
  string_view literal_01;
  string_view x;
  bool local_1c9;
  char *local_1b8;
  undefined1 local_1a8 [16];
  string out;
  StringOutputStream stream;
  undefined1 local_168 [16];
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_seen;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  insert_result;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  Msg new_msg;
  
  bVar5 = JsonLexer::Peek((JsonLexer *)field,kNull);
  if (bVar5) {
    JsonLexer::Expect(lex,field,4,"null");
    return (Status)(uintptr_t)lex;
  }
  keys_seen.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  keys_seen.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  keys_seen.
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control =
       (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  JsonLexer::Expect(lex,field,1,"{");
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    absl::lts_20240722::Status::~Status((Status *)lex);
    JsonLexer::Push(lex);
    if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
      absl::lts_20240722::Status::~Status((Status *)lex);
      literal._M_str = "}";
      literal._M_len = 1;
      bVar5 = JsonLexer::Peek((JsonLexer *)field,literal);
      if (bVar5) {
        piVar1 = (int *)((long)&field[2].parent_ + 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        local_1c9 = true;
        local_1b8 = "expected \',\'";
        do {
          if (local_1c9 == false) goto LAB_00295740;
          JsonLexer::SkipToToken(lex);
          if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00295755;
          absl::lts_20240722::Status::~Status((Status *)lex);
          absl::lts_20240722::
          StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          cVar6 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field);
          if ((cVar6 == '\"') ||
             (cVar6 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field),
             cVar6 == '\'')) {
            JsonLexer::ParseUtf8
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&new_msg,(JsonLexer *)field);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=(&key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&new_msg);
LAB_002953e4:
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)&new_msg);
            absl::lts_20240722::Status::Status
                      ((Status *)lex,
                       (Status *)
                       &key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      );
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002956f1;
            absl::lts_20240722::Status::~Status((Status *)lex);
            JsonLexer::Expect(lex,field,1,":");
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002956f1;
            absl::lts_20240722::Status::~Status((Status *)lex);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::EnsureOk(&key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      );
            piVar1 = (int *)(*(size_t *)
                              ((long)&((field[4].pool_)->messages_).
                                      super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                                      .
                                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>
                                      .settings_.
                                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                      .
                                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                              + 8) - 8);
            *piVar1 = *piVar1 + 1;
            new_msg.stream_.impl_._0_16_ =
                 MaybeOwnedString::AsView
                           (&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1.data_.value);
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace<std::basic_string_view<char,_std::char_traits<char>_>,_0>
                      (&insert_result,
                       &keys_seen.
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ,(basic_string_view<char,_std::char_traits<char>_> *)&new_msg);
            if (insert_result.second == false) {
              out._M_dataplus._M_p = "got unexpectedly-repeated repeated map key: \'%s\'";
              out._M_string_length = 0x30;
              stream = (StringOutputStream)
                       MaybeOwnedString::AsView
                                 (&key.
                                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   .field_1.data_.value);
              absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                        ((string *)&new_msg,(FormatSpec<std::basic_string_view<char>_> *)&out,
                         (basic_string_view<char,_std::char_traits<char>_> *)&stream);
              JsonLocation::Invalid
                        ((JsonLocation *)lex,
                         (undefined1 *)
                         ((long)&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),new_msg.stream_.impl_.buffer_end_,
                         new_msg.stream_.impl_.end_);
              std::__cxx11::string::~string((string *)&new_msg);
            }
            else {
              uVar2 = *(ulong *)((msg->stream_).impl_.buffer_end_ + 0x30);
              local_168._0_8_ =
                   &key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    .field_1;
              local_168._8_8_ = field;
              ParseProto3Type::RecordAsSeen((Field)msg,in_RCX);
              url._M_str = *(char **)((uVar2 & 0xfffffffffffffffc) + 8);
              url._M_len = **(size_t **)(msg->stream_).impl_.buffer_;
              ResolverPool::FindMessage((ResolverPool *)local_1a8,url);
              absl::lts_20240722::Status::Status((Status *)lex,(Status *)local_1a8);
              if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                absl::lts_20240722::Status::~Status((Status *)lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
                EnsureOk((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                          *)local_1a8);
                entry = local_1a8._8_8_;
                puVar3 = (msg->stream_).impl_.buffer_end_;
                if (*(int *)(puVar3 + 0x48) == 10) {
                  io::CodedOutputStream::WriteVarint32
                            (&in_RCX->stream_,*(int *)(puVar3 + 0x50) * 8 + 3);
                  ParseMap<google::protobuf::json_internal::ParseProto3Type>::
                  anon_class_32_4_5119429f::operator()::anon_class_16_2_441bf789::operator()
                            ((anon_class_16_2_441bf789 *)lex,
                             (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_168,
                             (Msg<google::protobuf::json_internal::ParseProto3Type> *)entry);
                  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                    absl::lts_20240722::Status::~Status((Status *)lex);
                    io::CodedOutputStream::WriteVarint32
                              (&in_RCX->stream_,
                               *(int *)((msg->stream_).impl_.buffer_end_ + 0x50) * 8 + 4);
                    (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
                  }
                }
                else {
                  out._M_dataplus._M_p = (pointer)&out.field_2;
                  out._M_string_length = 0;
                  out.field_2._M_local_buf[0] = '\0';
                  io::StringOutputStream::StringOutputStream(&stream,&out);
                  ParseProto3Type::Msg::Msg(&new_msg,&stream.super_ZeroCopyOutputStream);
                  ParseMap<google::protobuf::json_internal::ParseProto3Type>::
                  anon_class_32_4_5119429f::operator()::anon_class_16_2_441bf789::operator()
                            ((anon_class_16_2_441bf789 *)lex,
                             (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_168,
                             (Msg<google::protobuf::json_internal::ParseProto3Type> *)entry);
                  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
                    absl::lts_20240722::Status::~Status((Status *)lex);
                    io::CodedOutputStream::Trim(&new_msg.stream_);
                    _Var4 = out._M_dataplus;
                    iVar7 = io::CodedOutputStream::ByteCount(&new_msg.stream_);
                    x._M_str = in_R8;
                    x._M_len = (size_t)_Var4._M_p;
                    ParseProto3Type::SetString
                              ((ParseProto3Type *)msg,(Field)in_RCX,(Msg *)(long)iVar7,x);
                    (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
                  }
                  ParseProto3Type::Msg::~Msg(&new_msg);
                  std::__cxx11::string::~string((string *)&out);
                }
              }
              absl::lts_20240722::Status::~Status((Status *)local_1a8);
            }
            if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002956f1;
            absl::lts_20240722::Status::~Status((Status *)lex);
            literal_00._M_str = ",";
            literal_00._M_len = 1;
            local_1c9 = JsonLexer::Peek((JsonLexer *)field,literal_00);
            bVar5 = true;
          }
          else {
            if (*(char *)&field[2].type_ == '\x01') {
              JsonLexer::ParseBareWord
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&new_msg,(JsonLexer *)field);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&new_msg);
              goto LAB_002953e4;
            }
            JsonLocation::Invalid((JsonLocation *)lex,field + 3,0xc,"expected \'\"\'");
LAB_002956f1:
            bVar5 = false;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         );
          if (!bVar5) goto LAB_00295755;
          literal_01._M_str = "}";
          literal_01._M_len = 1;
          bVar5 = JsonLexer::Peek((JsonLexer *)field,literal_01);
        } while (!bVar5);
        piVar1 = (int *)((long)&field[2].parent_ + 4);
        *piVar1 = *piVar1 + 1;
        if ((*(char *)&field[2].type_ == '\0') && (local_1c9 != false)) {
          local_1b8 = "expected \'}\'";
LAB_00295740:
          JsonLocation::Invalid((JsonLocation *)lex,field + 3,0xc,local_1b8);
          goto LAB_00295755;
        }
      }
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
  }
LAB_00295755:
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&keys_seen.
                   super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseMap(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::flat_hash_set<std::string> keys_seen;
  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& key) -> absl::Status {
        lex.path().NextRepeated();
        auto insert_result = keys_seen.emplace(key.value.AsView());
        if (!insert_result.second) {
          return key.loc.Invalid(absl::StrFormat(
              "got unexpectedly-repeated repeated map key: '%s'",
              key.value.AsView()));
        }
        return Traits::NewMsg(
            field, msg,
            [&](const Desc<Traits>& type, Msg<Traits>& entry) -> absl::Status {
              auto key_field = Traits::KeyField(type);
              switch (Traits::FieldType(key_field)) {
                case FieldDescriptor::TYPE_INT64:
                case FieldDescriptor::TYPE_SINT64:
                case FieldDescriptor::TYPE_SFIXED64: {
                  int64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT64:
                case FieldDescriptor::TYPE_FIXED64: {
                  uint64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_INT32:
                case FieldDescriptor::TYPE_SINT32:
                case FieldDescriptor::TYPE_SFIXED32: {
                  int32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT32:
                case FieldDescriptor::TYPE_FIXED32: {
                  uint32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_BOOL: {
                  if (key.value == "true") {
                    Traits::SetBool(key_field, entry, true);
                  } else if (key.value == "false") {
                    Traits::SetBool(key_field, entry, false);
                  } else {
                    return key.loc.Invalid(absl::StrFormat(
                        "expected bool string, got '%s'", key.value.AsView()));
                  }
                  break;
                }
                case FieldDescriptor::TYPE_STRING: {
                  Traits::SetString(key_field, entry,
                                    std::move(key.value.ToString()));
                  break;
                }
                default:
                  return lex.Invalid("unsupported map key type");
              }

              return ParseSingular<Traits>(lex, Traits::ValueField(type),
                                           entry);
            });
      });
}